

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ImDrawList *this;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ImDrawVert *pIVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  ImGuiContext *pIVar11;
  unsigned_short *puVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ImVec2 triangle [3];
  ImVec2 local_a8;
  ImVec2 local_98;
  ImVec2 local_88 [4];
  ImGuiContext *local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GImGui;
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar12 = (unsigned_short *)0x0;
  }
  else {
    puVar12 = (draw_list->IdxBuffer).Data;
  }
  this = &GImGui->ForegroundDrawList;
  uVar4 = draw_cmd->VtxOffset;
  pIVar6 = (draw_list->VtxBuffer).Data;
  uVar2._0_4_ = (draw_cmd->ClipRect).x;
  uVar2._4_4_ = (draw_cmd->ClipRect).y;
  uVar3._0_4_ = (draw_cmd->ClipRect).z;
  uVar3._4_4_ = (draw_cmd->ClipRect).w;
  uVar5 = (GImGui->ForegroundDrawList).Flags;
  (GImGui->ForegroundDrawList).Flags = uVar5 & 0xfffffffe;
  uVar9 = draw_cmd->IdxOffset;
  uVar13 = (ulong)uVar9;
  if (uVar9 < draw_cmd->ElemCount + uVar9) {
    uStack_50 = 0;
    uStack_40 = 0;
    local_68 = pIVar11;
    auVar19 = _DAT_00171230;
    auVar20 = _DAT_001711a0;
    local_58 = uVar2;
    local_48 = uVar3;
    do {
      local_88[0].x = 0.0;
      local_88[0].y = 0.0;
      local_88[1].x = 0.0;
      local_88[1].y = 0.0;
      local_88[2].x = 0.0;
      local_88[2].y = 0.0;
      lVar10 = 0;
      uVar2._0_4_ = auVar20._0_4_;
      uVar3._0_4_ = auVar20._4_4_;
      uVar14 = auVar20._8_4_;
      uVar15 = auVar20._12_4_;
      uVar2._4_4_ = auVar19._0_4_;
      uVar3._4_4_ = auVar19._4_4_;
      uVar16 = auVar19._8_4_;
      uVar17 = auVar19._12_4_;
      do {
        uVar1 = (uVar13 & 0xffffffff) + lVar10;
        uVar9 = (uint)uVar1;
        if (puVar12 != (unsigned_short *)0x0) {
          uVar9 = (uint)puVar12[uVar1 & 0xffffffff];
        }
        IVar7 = pIVar6[(ulong)uVar4 + (ulong)uVar9].pos;
        local_88[lVar10] = IVar7;
        auVar18._8_8_ = 0;
        auVar18._0_4_ = IVar7.x;
        auVar18._4_4_ = IVar7.y;
        auVar19._4_4_ = (float)uVar3;
        auVar19._0_4_ = (float)uVar2;
        auVar19._8_4_ = uVar14;
        auVar19._12_4_ = uVar15;
        auVar20 = minps(auVar18,auVar19);
        auVar8._4_4_ = uVar3._4_4_;
        auVar8._0_4_ = uVar2._4_4_;
        auVar8._8_4_ = uVar16;
        auVar8._12_4_ = uVar17;
        auVar19 = maxps(auVar18,auVar8);
        lVar10 = lVar10 + 1;
        uVar2._0_4_ = auVar20._0_4_;
        uVar3._0_4_ = auVar20._4_4_;
        uVar14 = auVar20._8_4_;
        uVar15 = auVar20._12_4_;
        uVar2._4_4_ = auVar19._0_4_;
        uVar3._4_4_ = auVar19._4_4_;
        uVar16 = auVar19._8_4_;
        uVar17 = auVar19._12_4_;
      } while (lVar10 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(this,local_88,3,0xff00ffff,true,1.0);
      }
      uVar13 = (uVar13 & 0xffffffff) + 3;
    } while ((uint)uVar13 < draw_cmd->ElemCount + draw_cmd->IdxOffset);
    local_98.y = (float)(int)(float)uVar3;
    local_98.x = (float)(int)(float)uVar2;
    local_a8.y = (float)(int)uVar3._4_4_;
    local_a8.x = (float)(int)uVar2._4_4_;
    pIVar11 = local_68;
    uVar2._0_4_ = (float)local_58;
    uVar2._4_4_ = local_58._4_4_;
    uVar3._0_4_ = (float)local_48;
    uVar3._4_4_ = local_48._4_4_;
  }
  if (show_aabb) {
    local_88[0].y = (float)(int)uVar2._4_4_;
    local_88[0].x = (float)(int)(float)uVar2;
    local_60.y = (float)(int)uVar3._4_4_;
    local_60.x = (float)(int)(float)uVar3;
    ImDrawList::AddRect(this,local_88,&local_60,0xffff00ff,0.0,0xf,1.0);
    local_88[0] = local_98;
    local_60 = local_a8;
    ImDrawList::AddRect(this,local_88,&local_60,0xffffff00,0.0,0xf,1.0);
  }
  (pIVar11->ForegroundDrawList).Flags = uVar5;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = fg_draw_list->Flags;
    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    fg_draw_list->Flags = backup_flags;
}